

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qplatformdialoghelper.cpp
# Opt level: O1

void QPlatformColorDialogHelper::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QPlatformColorDialogHelper_to_subr *candidate;
  undefined4 uVar2;
  int iVar3;
  long in_FS_OFFSET;
  void *local_28;
  void *pvStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if ((((code *)*plVar1 == currentColorChanged) && (uVar2 = 0, plVar1[1] == 0)) ||
       (((code *)*plVar1 == colorSelected && (uVar2 = 1, plVar1[1] == 0)))) {
      *(undefined4 *)*_a = uVar2;
    }
  }
  else if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      pvStack_20 = _a[1];
      iVar3 = 1;
    }
    else {
      if (_id != 0) goto LAB_002f7c6a;
      pvStack_20 = _a[1];
      iVar3 = 0;
    }
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_28);
  }
LAB_002f7c6a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlatformColorDialogHelper::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPlatformColorDialogHelper *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentColorChanged((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        case 1: _t->colorSelected((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QPlatformColorDialogHelper::*)(const QColor & )>(_a, &QPlatformColorDialogHelper::currentColorChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QPlatformColorDialogHelper::*)(const QColor & )>(_a, &QPlatformColorDialogHelper::colorSelected, 1))
            return;
    }
}